

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

int log_define(char *name,log_policy policy)

{
  log_aspect_id aspect_id;
  int iVar1;
  log_impl impl;
  log_aspect aspect;
  log_aspect_interface iface;
  
  impl = log_singleton_get(name);
  aspect_id = log_policy_aspect_id(policy);
  aspect = log_impl_aspect(impl,aspect_id);
  if (aspect == (log_aspect)0x0) {
    iface = log_impl_aspect_interface(aspect_id);
    aspect = log_aspect_create(impl,iface,(log_aspect_ctor)0x0);
    if (aspect == (log_aspect)0x0) {
      return 1;
    }
    log_impl_define(impl,aspect,aspect_id);
  }
  iVar1 = log_aspect_attach(aspect,policy);
  return (uint)(iVar1 != 0);
}

Assistant:

int log_define(const char *name, log_policy policy)
{
	log_impl impl = log_singleton_get(name);

	enum log_aspect_id aspect_id = log_policy_aspect_id(policy);

	log_aspect aspect = log_impl_aspect(impl, aspect_id);

	if (aspect == NULL)
	{
		log_aspect_interface aspect_iface = log_impl_aspect_interface(aspect_id);

		/* TODO: review aspect constructor */

		aspect = log_aspect_create(impl, aspect_iface, NULL);

		if (aspect == NULL)
		{
			return 1;
		}

		log_impl_define(impl, aspect, aspect_id);
	}

	if (log_aspect_attach(aspect, policy) != 0)
	{
		return 1;
	}

	return 0;
}